

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monster_test_builder.h
# Opt level: O0

MyGame_Example_Monster_ref_t
MyGame_Example_Monster_clone(flatbuffers_builder_t *B,MyGame_Example_Monster_table_t t)

{
  int iVar1;
  MyGame_Example_Monster_ref_t ref;
  flatcc_builder_ref_t _ref;
  MyGame_Example_Monster_table_t t_local;
  flatbuffers_builder_t *B_local;
  
  B_local._4_4_ = flatcc_builder_refmap_find(B,t);
  if (B_local._4_4_ == 0) {
    iVar1 = MyGame_Example_Monster_start(B);
    if (((((((((iVar1 == 0) && (iVar1 = MyGame_Example_Monster_pos_pick(B,t), iVar1 == 0)) &&
             (iVar1 = MyGame_Example_Monster_testhashs64_fnv1_pick(B,t), iVar1 == 0)) &&
            ((iVar1 = MyGame_Example_Monster_testhashu64_fnv1_pick(B,t), iVar1 == 0 &&
             (iVar1 = MyGame_Example_Monster_testhashs64_fnv1a_pick(B,t), iVar1 == 0)))) &&
           ((iVar1 = MyGame_Example_Monster_testhashu64_fnv1a_pick(B,t), iVar1 == 0 &&
            ((iVar1 = MyGame_Example_Monster_name_pick(B,t), iVar1 == 0 &&
             (iVar1 = MyGame_Example_Monster_inventory_pick(B,t), iVar1 == 0)))))) &&
          (iVar1 = MyGame_Example_Monster_testarrayoftables_pick(B,t), iVar1 == 0)) &&
         (((((iVar1 = MyGame_Example_Monster_testarrayofstring_pick(B,t), iVar1 == 0 &&
             (iVar1 = MyGame_Example_Monster_testarrayofstring2_pick(B,t), iVar1 == 0)) &&
            (iVar1 = MyGame_Example_Monster_testarrayofbools_pick(B,t), iVar1 == 0)) &&
           (((iVar1 = MyGame_Example_Monster_testarrayofsortedstruct_pick(B,t), iVar1 == 0 &&
             (iVar1 = MyGame_Example_Monster_enemy_pick(B,t), iVar1 == 0)) &&
            ((iVar1 = MyGame_Example_Monster_test_pick(B,t), iVar1 == 0 &&
             ((iVar1 = MyGame_Example_Monster_test4_pick(B,t), iVar1 == 0 &&
              (iVar1 = MyGame_Example_Monster_test5_pick(B,t), iVar1 == 0)))))))) &&
          ((iVar1 = MyGame_Example_Monster_testnestedflatbuffer_pick(B,t), iVar1 == 0 &&
           (((iVar1 = MyGame_Example_Monster_testempty_pick(B,t), iVar1 == 0 &&
             (iVar1 = MyGame_Example_Monster_testhashs32_fnv1_pick(B,t), iVar1 == 0)) &&
            (iVar1 = MyGame_Example_Monster_testhashu32_fnv1_pick(B,t), iVar1 == 0)))))))) &&
        ((((iVar1 = MyGame_Example_Monster_testhashs32_fnv1a_pick(B,t), iVar1 == 0 &&
           (iVar1 = MyGame_Example_Monster_testhashu32_fnv1a_pick(B,t), iVar1 == 0)) &&
          (((iVar1 = MyGame_Example_Monster_testf_pick(B,t), iVar1 == 0 &&
            ((iVar1 = MyGame_Example_Monster_testf2_pick(B,t), iVar1 == 0 &&
             (iVar1 = MyGame_Example_Monster_testf3_pick(B,t), iVar1 == 0)))) &&
           (iVar1 = MyGame_Example_Monster_flex_pick(B,t), iVar1 == 0)))) &&
         ((((iVar1 = MyGame_Example_Monster_vector_of_longs_pick(B,t), iVar1 == 0 &&
            (iVar1 = MyGame_Example_Monster_vector_of_doubles_pick(B,t), iVar1 == 0)) &&
           (iVar1 = MyGame_Example_Monster_parent_namespace_test_pick(B,t), iVar1 == 0)) &&
          ((iVar1 = MyGame_Example_Monster_testbase64_pick(B,t), iVar1 == 0 &&
           (iVar1 = MyGame_Example_Monster_hp_pick(B,t), iVar1 == 0)))))))) &&
       ((iVar1 = MyGame_Example_Monster_mana_pick(B,t), iVar1 == 0 &&
        ((iVar1 = MyGame_Example_Monster_color_pick(B,t), iVar1 == 0 &&
         (iVar1 = MyGame_Example_Monster_testbool_pick(B,t), iVar1 == 0)))))) {
      ref = MyGame_Example_Monster_end(B);
      B_local._4_4_ = flatcc_builder_refmap_insert(B,t,ref);
    }
    else {
      B_local._4_4_ = 0;
    }
  }
  return B_local._4_4_;
}

Assistant:

static MyGame_Example_Monster_ref_t MyGame_Example_Monster_clone(flatbuffers_builder_t *B, MyGame_Example_Monster_table_t t)
{
    __flatbuffers_memoize_begin(B, t);
    if (MyGame_Example_Monster_start(B)
        || MyGame_Example_Monster_pos_pick(B, t)
        || MyGame_Example_Monster_testhashs64_fnv1_pick(B, t)
        || MyGame_Example_Monster_testhashu64_fnv1_pick(B, t)
        || MyGame_Example_Monster_testhashs64_fnv1a_pick(B, t)
        || MyGame_Example_Monster_testhashu64_fnv1a_pick(B, t)
        || MyGame_Example_Monster_name_pick(B, t)
        || MyGame_Example_Monster_inventory_pick(B, t)
        || MyGame_Example_Monster_testarrayoftables_pick(B, t)
        || MyGame_Example_Monster_testarrayofstring_pick(B, t)
        || MyGame_Example_Monster_testarrayofstring2_pick(B, t)
        || MyGame_Example_Monster_testarrayofbools_pick(B, t)
        || MyGame_Example_Monster_testarrayofsortedstruct_pick(B, t)
        || MyGame_Example_Monster_enemy_pick(B, t)
        || MyGame_Example_Monster_test_pick(B, t)
        || MyGame_Example_Monster_test4_pick(B, t)
        || MyGame_Example_Monster_test5_pick(B, t)
        || MyGame_Example_Monster_testnestedflatbuffer_pick(B, t)
        || MyGame_Example_Monster_testempty_pick(B, t)
        || MyGame_Example_Monster_testhashs32_fnv1_pick(B, t)
        || MyGame_Example_Monster_testhashu32_fnv1_pick(B, t)
        || MyGame_Example_Monster_testhashs32_fnv1a_pick(B, t)
        || MyGame_Example_Monster_testhashu32_fnv1a_pick(B, t)
        || MyGame_Example_Monster_testf_pick(B, t)
        || MyGame_Example_Monster_testf2_pick(B, t)
        || MyGame_Example_Monster_testf3_pick(B, t)
        || MyGame_Example_Monster_flex_pick(B, t)
        || MyGame_Example_Monster_vector_of_longs_pick(B, t)
        || MyGame_Example_Monster_vector_of_doubles_pick(B, t)
        || MyGame_Example_Monster_parent_namespace_test_pick(B, t)
        || MyGame_Example_Monster_testbase64_pick(B, t)
        || MyGame_Example_Monster_hp_pick(B, t)
        || MyGame_Example_Monster_mana_pick(B, t)
        || MyGame_Example_Monster_color_pick(B, t)
        || MyGame_Example_Monster_testbool_pick(B, t)) {
        return 0;
    }
    __flatbuffers_memoize_end(B, t, MyGame_Example_Monster_end(B));
}